

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_Elastic_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Collision_Elastic_PDU::Encode(Collision_Elastic_PDU *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Collision_Elastic_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar1 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_IssuingEntityID);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_CollidingEntityID);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_EventID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Padding1);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_ContactVelocity).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32Mass);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Location).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32CIRXX);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32CIRXY);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32CIRXZ);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32CIRYY);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32CIRYZ);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32CIRZZ);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_UnitSurfaceNormal).super_DataTypeBase);
  KDataStream::operator<<(pKVar1,(float)this->m_f32COR);
  return;
}

Assistant:

void Collision_Elastic_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );
    stream << KDIS_STREAM m_IssuingEntityID
           << KDIS_STREAM m_CollidingEntityID
           << KDIS_STREAM m_EventID
           << m_ui16Padding1
           << KDIS_STREAM m_ContactVelocity
           << m_f32Mass
           << KDIS_STREAM m_Location
           << m_f32CIRXX
           << m_f32CIRXY
           << m_f32CIRXZ
           << m_f32CIRYY
           << m_f32CIRYZ
           << m_f32CIRZZ
           << KDIS_STREAM m_UnitSurfaceNormal
           << m_f32COR;
}